

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema.h
# Opt level: O3

void __thiscall
rapidjson::
GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
::BelowMinimum(GenericSchemaValidator<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>,_rapidjson::BaseReaderHandler<rapidjson::UTF8<char>,_void>,_rapidjson::CrtAllocator>
               *this,double actual,SValue *expected,bool exclusive)

{
  int iVar1;
  undefined7 in_register_00000011;
  code *exclusive_00;
  Data local_18;
  
  iVar1 = (int)CONCAT71(in_register_00000011,exclusive);
  local_18.s.str = (Ch *)0x216000000000000;
  if (iVar1 == 0) {
    exclusive_00 = (_func_ValueType_ptr *)0x0;
  }
  else {
    exclusive_00 = internal::
                   Schema<rapidjson::GenericSchemaDocument<rapidjson::GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>,_rapidjson::CrtAllocator>_>
                   ::GetExclusiveMinimumString;
  }
  local_18.n = (Number)actual;
  AddNumberError(this,iVar1 + kValidateErrorMinimum,(ValueType *)&local_18.s,expected,exclusive_00);
  GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator>::~GenericValue
            ((GenericValue<rapidjson::UTF8<char>,_rapidjson::CrtAllocator> *)&local_18.s);
  return;
}

Assistant:

void BelowMinimum(double actual, const SValue& expected, bool exclusive) {
        AddNumberError(exclusive ? kValidateErrorExclusiveMinimum : kValidateErrorMinimum, ValueType(actual).Move(), expected,
            exclusive ? &SchemaType::GetExclusiveMinimumString : 0);
    }